

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::BlockArrayIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BlockArrayIndexingCaseInstance *this)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer piVar7;
  TestStatus *pTVar8;
  DeviceInterface *vk;
  undefined1 auVar9 [8];
  VkDescriptorType descriptorType;
  pointer pSVar11;
  Buffer *this_00;
  long *plVar12;
  pointer piVar13;
  ShaderExecutor *pSVar14;
  pointer puVar15;
  VkDevice pVVar16;
  int readNdx;
  void *pvVar17;
  uint *puVar18;
  long lVar19;
  BlockArrayIndexingCaseInstance *pBVar20;
  long lVar21;
  pointer puVar22;
  bool bVar23;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> bufferInfos;
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  Move<vk::Handle<(vk::HandleType)22>_> extraResourcesSet;
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  buffers;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  VkDescriptorPoolSize poolSizes [2];
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  Move<vk::Handle<(vk::HandleType)19>_> extraResourcesLayout;
  vector<void_*,_std::allocator<void_*>_> outputs;
  Move<vk::Handle<(vk::HandleType)21>_> extraResourcesSetPool;
  VkDescriptorSetLayoutBinding bindings [2];
  undefined1 local_368 [24];
  undefined8 uStack_350;
  VkAllocationCallbacks *local_340;
  Allocation *local_338;
  uint *local_330;
  uint *local_328;
  BlockArrayIndexingCaseInstance *local_320;
  Handle<(vk::HandleType)21> local_318;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_310;
  VkDescriptorPoolSize local_2f8;
  VkDevice pVStack_2f0;
  VkDevice local_2e8;
  undefined8 uStack_2e0;
  TestStatus *local_2d0;
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  local_2c8;
  UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  local_2a8;
  VkDescriptorPoolSize local_298;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_290;
  void *local_278;
  void *pvStack_270;
  long local_268;
  vector<int,_std::allocator<int>_> local_258;
  DeviceInterface *local_238;
  string *local_230;
  VkDescriptorPoolSize local_228;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_220;
  void *local_208;
  undefined8 uStack_200;
  long local_1f8;
  VkDescriptorPool local_1e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_1e0;
  Buffer *local_1c0;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  Buffer local_1a8;
  ios_base local_140 [272];
  VkDescriptorType VVar10;
  
  local_328 = (uint *)operator_new(0x200);
  memset(local_328,0,0x200);
  local_1c0 = (Buffer *)
              ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context)->m_testCtx
              ->m_log;
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  local_230 = (string *)&__return_storage_ptr__->m_description;
  local_340 = (VkAllocationCallbacks *)&(__return_storage_ptr__->m_description).field_2;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_340;
  std::__cxx11::string::_M_construct<char*>(local_230,local_1b8,(long)local_1b0 + (long)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)local_1a8.m_vkd + 1));
  }
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_268 = 0;
  local_278 = (void *)0x0;
  pvStack_270 = (void *)0x0;
  local_1f8 = 0;
  local_208 = (void *)0x0;
  uStack_200 = 0;
  bVar23 = *(int *)&(this->super_OpaqueTypeIndexingTestInstance).field_0x34 == 0;
  local_330 = (uint *)CONCAT71(local_330._1_7_,!bVar23);
  local_238 = Context::getDeviceInterface
                        ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  local_2d0 = __return_storage_ptr__;
  local_338 = (Allocation *)
              Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                                 m_context);
  puVar15 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_start;
  puVar22 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  lVar21 = (long)puVar22 - (long)puVar15;
  local_320 = this;
  if ((ulong)(lVar21 >> 2) >> 0x3b == 0) {
    local_2c8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar22 == puVar15) {
      pSVar11 = (pointer)0x0;
    }
    else {
      pSVar11 = (pointer)operator_new(lVar21 * 4);
    }
    VVar10 = (VkDescriptorType)bVar23;
    descriptorType = VVar10 ^ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
    local_2c8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar11 + (lVar21 >> 2);
    local_2c8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar11;
    if (puVar22 != puVar15) {
      local_2c8.
      super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
      memset(pSVar11,0,lVar21 * 4);
      pSVar11 = (pointer)((long)pSVar11 + lVar21 * 4);
    }
    pBVar20 = local_320;
    local_2a8.m_data.ptr = (Buffer *)0x0;
    DStack_220.m_device = (VkDevice)0x0;
    DStack_220.m_allocator = (VkAllocationCallbacks *)0x0;
    local_228.type = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_228.descriptorCount = 0;
    DStack_220.m_deviceIface = (DeviceInterface *)0x0;
    DStack_1e0.m_device = (VkDevice)0x0;
    DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_1e8.m_internal = 0;
    DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
    local_2e8 = (VkDevice)0x0;
    uStack_2e0 = 0;
    local_2f8.type = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_2f8.descriptorCount = 0;
    pVStack_2f0 = (VkDevice)0x0;
    local_2c8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
    OpaqueTypeIndexingTestInstance::checkSupported
              (&local_320->super_OpaqueTypeIndexingTestInstance,descriptorType);
    puVar15 = (pBVar20->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 !=
        (pBVar20->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      local_330 = (uint *)CONCAT44(local_330._4_4_,(uint)(byte)local_330 * 0x10 + 0x10);
      lVar21 = 0;
      puVar22 = (pointer)0x0;
      do {
        this_00 = (Buffer *)operator_new(0x40);
        anon_unknown_0::Buffer::Buffer
                  (this_00,(pBVar20->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                           m_context,(VkBufferUsageFlags)local_330,4);
        plVar12 = (long *)operator_new(0x20);
        pSVar11 = local_2c8.
                  super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)(plVar12 + 1) = 0;
        *(undefined4 *)((long)plVar12 + 0xc) = 0;
        *plVar12 = (long)&PTR__SharedPtrState_00d7e160;
        plVar12[2] = (long)this_00;
        *(undefined4 *)(plVar12 + 1) = 1;
        *(undefined4 *)((long)plVar12 + 0xc) = 1;
        plVar5 = *(long **)((long)&(local_2c8.
                                    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar21);
        if (plVar5 != plVar12) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)
               ((long)&(local_2c8.
                        super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar21) = 0;
              (**(code **)(**(long **)((long)&(local_2c8.
                                               super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                      lVar21) + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(*(long *)((long)&pSVar11->m_state + lVar21) + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              plVar5 = *(long **)((long)&pSVar11->m_state + lVar21);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&pSVar11->m_state + lVar21) = 0;
            }
          }
          *(Buffer **)((long)&pSVar11->m_ptr + lVar21) = this_00;
          *(long **)((long)&pSVar11->m_state + lVar21) = plVar12;
          LOCK();
          *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
          UNLOCK();
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar11->m_state + lVar21) + 0xc);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pBVar20 = local_320;
        LOCK();
        plVar5 = plVar12 + 1;
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar12 + 0x10))(plVar12);
        }
        LOCK();
        piVar1 = (int *)((long)plVar12 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)(*plVar12 + 8))(plVar12);
        }
        puVar6 = *(undefined8 **)
                  ((long)&(local_2c8.
                           super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar21);
        lVar19 = puVar6[6];
        **(uint **)(lVar19 + 0x18) =
             (pBVar20->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start[(long)puVar22];
        ::vk::flushMappedMemoryRange
                  ((DeviceInterface *)*puVar6,(VkDevice)puVar6[1],
                   (VkDeviceMemory)*(deUint64 *)(lVar19 + 8),*(VkDeviceSize *)(lVar19 + 0x10),
                   0xffffffffffffffff);
        puVar22 = (pointer)((long)puVar22 + 1);
        puVar15 = (pointer)((long)(pBVar20->m_inValues->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pBVar20->m_inValues->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 2);
        lVar21 = lVar21 + 0x10;
      } while (puVar22 < puVar15);
    }
    if ((pBVar20->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
    {
      createUniformIndexBuffer
                ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                  *)local_1b8,
                 (pBVar20->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
                 (int)(pBVar20->m_readIndices->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start,(int *)puVar15);
      auVar9 = local_1b8;
      local_1b8 = (undefined1  [8])0x0;
      if ((undefined1  [8])local_2a8.m_data.ptr != auVar9) {
        de::details::
        UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
        ::reset(&local_2a8);
        local_2a8.m_data.ptr = (Buffer *)auVar9;
      }
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
               *)local_1b8);
    }
    local_1b8 = (undefined1  [8])((ulong)descriptorType << 0x20);
    local_1a8.m_device._0_4_ =
         (deUint32)
         ((ulong)((long)(pBVar20->m_inValues->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pBVar20->m_inValues->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    local_1b0 = (VkDevice *)CONCAT44(0x7fffffff,(deUint32)local_1a8.m_device);
    local_1a8.m_vkd = (DeviceInterface *)0x0;
    local_1a8.m_device._4_4_ = 6;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
         = 1;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_
         = 0x7fffffff;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_318.m_internal._0_4_ = 0x20;
    DStack_310.m_deviceIface = (DeviceInterface *)0x0;
    DStack_310.m_device = (VkDevice)0x200000000;
    DStack_310.m_allocator = (VkAllocationCallbacks *)local_1b8;
    ::vk::createDescriptorSetLayout
              ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_298,local_238,(VkDevice)local_338,
               (VkDescriptorSetLayoutCreateInfo *)&local_318,(VkAllocationCallbacks *)0x0);
    local_368._16_8_ = DStack_290.m_device;
    uStack_350 = DStack_290.m_allocator;
    local_368._0_4_ = local_298.type;
    local_368._4_4_ = local_298.descriptorCount;
    local_368._8_8_ = DStack_290.m_deviceIface;
    local_298.type = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_298.descriptorCount = 0;
    DStack_290.m_deviceIface = (DeviceInterface *)0x0;
    DStack_290.m_device = (VkDevice)0x0;
    DStack_290.m_allocator = (VkAllocationCallbacks *)0x0;
    if (local_228 != (VkDescriptorPoolSize)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&DStack_220,(VkDescriptorSetLayout)local_228);
    }
    DStack_220.m_device = (VkDevice)local_368._16_8_;
    DStack_220.m_allocator = uStack_350;
    local_228.type = local_368._0_4_;
    local_228.descriptorCount = local_368._4_4_;
    DStack_220.m_deviceIface = (DeviceInterface *)local_368._8_8_;
    if (local_298 != (VkDescriptorPoolSize)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&DStack_290,(VkDescriptorSetLayout)local_298);
    }
    vk = local_238;
    local_298 = (VkDescriptorPoolSize)
                (CONCAT44((int)((ulong)((long)(pBVar20->m_inValues->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pBVar20->m_inValues->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 2),
                          VVar10) ^ 7);
    DStack_290.m_deviceIface = (DeviceInterface *)0x100000006;
    local_1b8._0_4_ = 0x21;
    local_1b0 = (VkDevice *)0x0;
    local_1a8.m_vkd = (DeviceInterface *)0x100000001;
    local_1a8.m_device._0_4_ = 2;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)&local_298;
    ::vk::createDescriptorPool
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_318,local_238,(VkDevice)local_338,
               (VkDescriptorPoolCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
    local_368._16_8_ = DStack_310.m_device;
    uStack_350 = DStack_310.m_allocator;
    local_368._0_8_ = local_318.m_internal;
    local_368._8_8_ = DStack_310.m_deviceIface;
    local_318.m_internal = 0;
    DStack_310.m_deviceIface = (DeviceInterface *)0x0;
    DStack_310.m_device = (VkDevice)0x0;
    DStack_310.m_allocator = (VkAllocationCallbacks *)0x0;
    if (local_1e8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_1e0,local_1e8);
    }
    DStack_1e0.m_device = (VkDevice)local_368._16_8_;
    DStack_1e0.m_allocator = uStack_350;
    local_1e8.m_internal = local_368._0_8_;
    DStack_1e0.m_deviceIface = (DeviceInterface *)local_368._8_8_;
    if (local_318.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&DStack_310,(VkDescriptorPool)local_318.m_internal);
    }
    local_1b8._0_4_ = 0x22;
    local_1b0 = (VkDevice *)0x0;
    local_1a8.m_vkd = (DeviceInterface *)local_1e8.m_internal;
    local_1a8.m_device._0_4_ = 1;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)&local_228;
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_318,vk,(VkDevice)local_338,
               (VkDescriptorSetAllocateInfo *)local_1b8);
    local_368._16_8_ = DStack_310.m_device;
    uStack_350._0_4_ = SUB84(DStack_310.m_allocator,0);
    uStack_350._4_4_ = DStack_310.m_allocator._4_4_;
    local_368._0_8_ = local_318.m_internal;
    local_368._8_8_ = DStack_310.m_deviceIface;
    local_318.m_internal = 0;
    DStack_310.m_deviceIface = (DeviceInterface *)0x0;
    DStack_310.m_device = (VkDevice)0x0;
    DStack_310.m_allocator = (VkAllocationCallbacks *)0x0;
    if (local_2f8 != (VkDescriptorPoolSize)0x0) {
      local_298 = local_2f8;
      (**(code **)(*(long *)pVStack_2f0 + 0x1e8))(pVStack_2f0,local_2e8,uStack_2e0,1);
    }
    local_2e8 = (VkDevice)local_368._16_8_;
    uStack_2e0 = CONCAT44(uStack_350._4_4_,(undefined4)uStack_350);
    local_2f8 = (VkDescriptorPoolSize)local_368._0_8_;
    pVStack_2f0 = (VkDevice)local_368._8_8_;
    if ((Buffer *)local_318.m_internal != (Buffer *)0x0) {
      local_368._0_8_ = local_318.m_internal;
      (*(DStack_310.m_deviceIface)->_vptr_DeviceInterface[0x3d])
                (DStack_310.m_deviceIface,DStack_310.m_device,DStack_310.m_allocator,1);
    }
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
              ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
               local_368,
               (long)(pBVar20->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pBVar20->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)local_1b8);
    local_1b8._0_4_ = 0x23;
    local_1b0 = (VkDevice *)0x0;
    local_1a8.m_vkd = (DeviceInterface *)local_2f8;
    local_1a8.m_device._0_4_ = 0;
    local_1a8.m_device._4_4_ = 0;
    puVar15 = (pBVar20->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar22 = (pBVar20->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    lVar21 = (long)puVar15 - (long)puVar22 >> 2;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
         = (undefined4)lVar21;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)local_368._0_8_;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (puVar15 != puVar22) {
      lVar21 = lVar21 + (ulong)(lVar21 == 0);
      pVVar16 = (VkDevice)(local_368._0_8_ + 0x10);
      pSVar11 = local_2c8.
                super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ((_Vector_impl_data *)(pVVar16 + -0x10))->_M_start =
             (pointer)(pSVar11->m_ptr->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                      m_data.object.m_internal;
        *(pointer *)(pVVar16 + -8) = (pointer)0x0;
        *(pointer *)&pVVar16->field_0x0 = (pointer)0xffffffffffffffff;
        pSVar11 = pSVar11 + 1;
        pVVar16 = pVVar16 + 0x18;
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_
         = descriptorType;
    (*vk->_vptr_DeviceInterface[0x3e])(vk,local_338,1,local_1b8,0,0);
    if ((Buffer *)local_368._0_8_ != (Buffer *)0x0) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ - local_368._0_8_);
    }
    if (local_2a8.m_data.ptr != (Buffer *)0x0) {
      local_368._0_8_ =
           ((local_2a8.m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
           object.m_internal;
      local_368._8_8_ = (VkDevice)0x0;
      local_368._16_8_ = (VkDevice)0xffffffffffffffff;
      local_1b8._0_4_ = 0x23;
      local_1b0 = (VkDevice *)0x0;
      local_1a8.m_vkd = (DeviceInterface *)local_2f8;
      local_1a8.m_device._0_4_ =
           (deUint32)
           ((ulong)((long)(pBVar20->m_inValues->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pBVar20->m_inValues->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      local_1a8.m_device._4_4_ = 0;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
      _0_4_ = 1;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
      _4_4_ = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)local_368;
      (*vk->_vptr_DeviceInterface[0x3e])(vk,local_338,1,local_1b8,0,0);
    }
    if ((pBVar20->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
        INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
      std::vector<int,_std::allocator<int>_>::resize
                (&local_258,
                 ((long)(pBVar20->m_readIndices->super__Vector_base<int,_std::allocator<int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pBVar20->m_readIndices->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_start) * 8);
      piVar7 = (pBVar20->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar21 = 0;
      piVar13 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar2 = piVar7[lVar21];
        lVar19 = 0;
        do {
          *(int *)((long)piVar13 + lVar19) = iVar2;
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0x80);
        lVar21 = lVar21 + 1;
        piVar13 = piVar13 + 0x20;
      } while (lVar21 != 4);
      lVar21 = 0;
      do {
        local_1b8 = (undefined1  [8])
                    ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar21);
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&local_278,(void **)local_1b8);
        lVar21 = lVar21 + 0x80;
      } while (lVar21 != 0x200);
    }
    lVar21 = 0;
    do {
      local_1b8 = (undefined1  [8])((long)local_328 + lVar21);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&local_208,(void **)local_1b8);
      lVar21 = lVar21 + 0x80;
    } while (lVar21 != 0x200);
    pSVar14 = createExecutor((pBVar20->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                             m_context,(pBVar20->super_OpaqueTypeIndexingTestInstance).m_shaderType,
                             (pBVar20->super_OpaqueTypeIndexingTestInstance).m_shaderSpec,
                             (VkDescriptorSetLayout)local_228);
    pvVar17 = (void *)0x0;
    if (local_278 != pvStack_270) {
      pvVar17 = local_278;
    }
    (*pSVar14->_vptr_ShaderExecutor[2])(pSVar14,0x20,pvVar17,local_208,local_2f8);
    (*pSVar14->_vptr_ShaderExecutor[1])(pSVar14);
    lVar21 = 0;
    puVar18 = local_328;
    do {
      lVar19 = 0;
      local_330 = puVar18;
      do {
        uVar3 = (pBVar20->m_inValues->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start
                [(pBVar20->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar19]];
        uVar4 = *puVar18;
        if (uVar3 != uVar4) {
          local_1b8 = (undefined1  [8])local_1c0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"ERROR: at invocation ",0x15);
          std::ostream::operator<<((ostringstream *)&local_1b0,(int)lVar21);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", read ",7);
          std::ostream::operator<<((ostringstream *)&local_1b0,(int)lVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,": expected ",0xb);
          local_368._0_8_ = (DeviceInterface *)(ulong)uVar3;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_368,(ostream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", got ",6);
          local_368._0_8_ = (Buffer *)(ulong)uVar4;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_368,(ostream *)&local_1b0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
          std::ios_base::~ios_base(local_140);
          if (local_2d0->m_code == QP_TEST_RESULT_PASS) {
            local_368._0_8_ = local_368 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,"Invalid result value","");
            local_1b8._0_4_ = 1;
            local_1b0 = &local_1a8.m_device;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_368._0_8_,
                       (VkDevice)(local_368._8_8_ + local_368._0_8_));
            local_2d0->m_code = local_1b8._0_4_;
            std::__cxx11::string::operator=(local_230,(string *)&local_1b0);
            if (local_1b0 != &local_1a8.m_device) {
              operator_delete(local_1b0,
                              CONCAT44(local_1a8.m_device._4_4_,(deUint32)local_1a8.m_device) + 1);
            }
            if ((Buffer *)local_368._0_8_ != (Buffer *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
            }
          }
        }
        pTVar8 = local_2d0;
        lVar19 = lVar19 + 1;
        puVar18 = puVar18 + 0x20;
        pBVar20 = local_320;
      } while (lVar19 != 4);
      lVar21 = lVar21 + 1;
      puVar18 = local_330 + 1;
    } while (lVar21 != 0x20);
    if (local_2f8 != (VkDescriptorPoolSize)0x0) {
      local_1b8._0_4_ = local_2f8.type;
      local_1b8._4_4_ = local_2f8.descriptorCount;
      (*(*(_func_int ***)pVStack_2f0)[0x3d])(pVStack_2f0,local_2e8,uStack_2e0,1);
    }
    if (local_1e8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_1e0,local_1e8);
    }
    if (local_228 != (VkDescriptorPoolSize)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&DStack_220,(VkDescriptorSetLayout)local_228);
    }
    de::details::
    UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::reset(&local_2a8);
    std::
    vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ::~vector(&local_2c8);
    if (local_208 != (void *)0x0) {
      operator_delete(local_208,local_1f8 - (long)local_208);
    }
    if (local_278 != (void *)0x0) {
      operator_delete(local_278,local_268 - (long)local_278);
    }
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    operator_delete(local_328,0x200);
    return pTVar8;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

tcu::TestStatus BlockArrayIndexingCaseInstance::iterate (void)
{
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numReads			= NUM_READS;
	std::vector<deUint32>		outValues			(numInvocations*numReads);

	tcu::TestLog&				log					= m_context.getTestContext().getLog();
	tcu::TestStatus				testResult			= tcu::TestStatus::pass("Pass");

	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	const VkBufferUsageFlags	bufferUsage			= m_blockType == BLOCKTYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
	const VkDescriptorType		descriptorType		= m_blockType == BLOCKTYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	vector<BufferSp>			buffers				(m_inValues.size());
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(descriptorType);

	for (size_t bufferNdx = 0; bufferNdx < m_inValues.size(); ++bufferNdx)
	{
		buffers[bufferNdx] = BufferSp(new Buffer(m_context, bufferUsage, sizeof(deUint32)));
		*(deUint32*)buffers[bufferNdx]->getHostPtr() = m_inValues[bufferNdx];
		buffers[bufferNdx]->flush();
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numReads, &m_readIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,							descriptorType,						(deUint32)m_inValues.size(),	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ (deUint32)m_inValues.size(),	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,								VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ descriptorType,						(deUint32)m_inValues.size()	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,							}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		vector<VkDescriptorBufferInfo>	bufferInfos			(m_inValues.size());
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			(deUint32)m_inValues.size(),
			descriptorType,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfos[0],
			(const VkBufferView*)DE_NULL,
		};

		for (size_t ndx = 0; ndx < m_inValues.size(); ++ndx)
		{
			bufferInfos[ndx].buffer		= buffers[ndx]->getBuffer();
			bufferInfos[ndx].offset		= 0u;
			bufferInfos[ndx].range		= VK_WHOLE_SIZE;
		}

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			(deUint32)m_inValues.size(),	// dstBinding
			0u,								// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_readIndices.size());

		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			int* dst = &expandedIndices[numInvocations*readNdx];
			std::fill(dst, dst+numInvocations, m_readIndices[readNdx]);
		}

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			inputs.push_back(&expandedIndices[readNdx*numInvocations]);
	}

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		outputs.push_back(&outValues[readNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= m_inValues[m_readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
					<< ", read " << readNdx << ": expected "
					<< tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid result value");
			}
		}
	}

	return testResult;
}